

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  size_type sVar1;
  ulong uVar2;
  const_reference pvVar3;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *this_00;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *pvVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RDX;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  pair<boost::unordered::iterator_detail::iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_covenant::Sym>_>_>,_bool>
  pVar6;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> r;
  uint ri;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> pi;
  uint nt_1;
  Sym A;
  uint nt;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  new_non_terminals;
  CFG *in_stack_fffffffffffffe18;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar7;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  value_type vVar8;
  Rule *in_stack_fffffffffffffe30;
  CFG *in_stack_fffffffffffffe38;
  _Base_ptr *pp_Var9;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  *in_stack_fffffffffffffe40;
  TermFactory *in_stack_fffffffffffffe48;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_covenant::Sym>_>_>
  in_stack_fffffffffffffe58;
  pair<int,_covenant::Sym> in_stack_fffffffffffffe60;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
  *in_stack_fffffffffffffe70;
  uint local_dc;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> local_d8;
  uint local_bc;
  node_pointer local_b8;
  undefined1 local_b0;
  pair<int,_covenant::Sym> local_a8;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> local_a0 [2];
  Sym in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  *in_stack_ffffffffffffffa0;
  Sym in_stack_ffffffffffffffa8;
  uint uVar10;
  int in_stack_ffffffffffffffb4;
  CFG *in_stack_ffffffffffffffb8;
  CycleBreaking<covenant::Sym> *in_stack_ffffffffffffffc0;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  if (sVar1 != 1) {
    boost::unordered::
    unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
    ::unordered_map(in_stack_fffffffffffffe40);
    for (uVar10 = 0; uVar2 = (ulong)uVar10,
        sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX), uVar2 < sVar1;
        uVar10 = uVar10 + 1) {
      in_stack_ffffffffffffff98 = CFG::newVar((CFG *)in_stack_fffffffffffffe58.node_);
      in_stack_fffffffffffffe70 = local_a0;
      in_stack_fffffffffffffe68 = in_RSI;
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff98;
      CFG::getTermFactory(in_stack_fffffffffffffe18);
      Rule::E(in_stack_fffffffffffffe48);
      CFG::prod(in_stack_fffffffffffffe38,(Sym)(int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                in_stack_fffffffffffffe30);
      Rule::~Rule((Rule *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x2325da);
      std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)uVar10);
      in_stack_fffffffffffffe60 =
           std::make_pair<int_const&,covenant::Sym&>
                     ((int *)in_stack_fffffffffffffe18,(Sym *)0x232600);
      local_a8 = in_stack_fffffffffffffe60;
      pVar6 = boost::unordered::
              unordered_map<int,covenant::Sym,boost::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,covenant::Sym>>>
              ::insert<std::pair<int,covenant::Sym>>
                        (in_stack_fffffffffffffe40,
                         (pair<int,_covenant::Sym> *)in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe58 = pVar6.first.node_;
      local_b0 = pVar6.second;
      local_b8 = in_stack_fffffffffffffe58.node_;
    }
    local_bc = 0;
    while( true ) {
      uVar2 = (ulong)local_bc;
      sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
      if (sVar1 <= uVar2) break;
      pp_Var9 = &in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_bc);
      std::
      vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)pp_Var9,(long)*pvVar3);
      std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::vector
                (in_stack_fffffffffffffe70,
                 (vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                 in_stack_fffffffffffffe68);
      pp_Var9 = &in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_bc);
      std::
      vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)pp_Var9,(long)*pvVar3);
      std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::clear
                ((vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                 0x23277f);
      local_dc = 0;
      while( true ) {
        this_00 = (vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                  (ulong)local_dc;
        pvVar4 = (vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                 std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                 size(&local_d8);
        if (pvVar4 <= this_00) break;
        pvVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                 operator[](&local_d8,(ulong)local_dc);
        std::
        vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
        ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                      *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (long)pvVar5->rule);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   in_stack_fffffffffffffe70,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   in_stack_fffffffffffffe68);
        psVar7 = in_RSI;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_bc);
        vVar8 = *pvVar3;
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   in_stack_fffffffffffffe70,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   in_stack_fffffffffffffe68);
        boost::unordered::
        unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
        ::unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                         *)in_stack_fffffffffffffe60,
                        (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                         *)in_stack_fffffffffffffe58.node_);
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT44(vVar8,in_stack_fffffffffffffe20),psVar7);
        cycle_breaking_transf_rule
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   CONCAT44(uVar10,in_stack_ffffffffffffffa8.x),in_stack_ffffffffffffffa0,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98.x));
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x232897);
        boost::unordered::
        unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
        ::~unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                          *)0x2328a4);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)this_00);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)this_00);
        local_dc = local_dc + 1;
      }
      std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::~vector
                (this_00);
      local_bc = local_bc + 1;
    }
    boost::unordered::
    unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
    ::~unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                      *)0x2329b5);
  }
  return;
}

Assistant:

void  cycle_breaking_transf (CFG &g, 
                               const vector<int> &group, 
                               const set<int> &group_set)
  {
    if (group.size() == 1) return;

    boost::unordered_map<int, EdgeSym> new_non_terminals;
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      // add epsilon productions
      EdgeSym A( g.newVar () );
      g.prod(A, Rule::E (g.getTermFactory ()));
      new_non_terminals.insert(make_pair(group[nt], A));
      // LOG ("abstraction" , 
      //      cout << "Added " << A << " -> e " <<  " from " 
      //           << EdgeSym::mkVar(group[nt]) << "\n");
           
    }
    // iterate over each nonterminal in the mutually recursive group 
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      vector<CFG::ProdInfo> pi(g.prods[group[nt]]);
      g.prods[group[nt]].clear();
      // iterate over each rule in the production

      // LOG ("abstraction", 
      //      cout << "Production: "; g.printProduction(cout, group[nt]); cout << endl);

      for( unsigned int ri = 0; ri < pi.size(); ri++ )
      {
        vector<EdgeSym> r(g.rules[pi[ri].rule]);

        // LOG("abstraction", 
        //     cout << "\tRule: "; Rule(r, g.getTermFactory ()); cout << endl);

        cycle_breaking_transf_rule(g, 
                                   group[nt], 
                                   r, 
                                   new_non_terminals, 
                                   group_set);
      }
    }
  }